

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampSamplingTexture.cpp
# Opt level: O0

void __thiscall
glcts::TextureBorderClampSamplingTexture<unsigned_int,_unsigned_int>::initTest
          (TextureBorderClampSamplingTexture<unsigned_int,_unsigned_int> *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  GLuint GVar4;
  NotSupportedError *this_00;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestError *this_01;
  char *local_d8;
  char *fshaderCodePtr;
  string fshaderCode;
  char *vsCodePtr;
  string vsCode;
  GLfloat coords [8];
  GLfloat vertices [16];
  Functions *gl;
  TextureBorderClampSamplingTexture<unsigned_int,_unsigned_int> *this_local;
  long lVar6;
  
  if (((this->super_TestCaseBase).m_is_texture_border_clamp_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Texture border clamp functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
               ,0x96);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar6 + 0x708))(1,&this->m_vao_id);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"Could not generate vertex array object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x9d);
  (**(code **)(lVar6 + 0xd8))(this->m_vao_id);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"Error binding vertex array object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x9f);
  (**(code **)(lVar6 + 0x6f0))(1,&this->m_sampler_id);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"Error generating sampler object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0xa3);
  (**(code **)(lVar6 + 0x6d0))(1,&this->m_fbo_id);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"Error generating framebuffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0xa7);
  (**(code **)(lVar6 + 0x1c0))(0x3f000000,0x3f000000,0x3f000000,0x3f800000);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"Error setting clear color value!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0xab);
  coords[6] = -1.0;
  coords[7] = -1.0;
  coords[2] = 2.0;
  coords[3] = -1.0;
  coords[4] = 2.0;
  coords[5] = 2.0;
  vsCode.field_2._8_4_ = 0xbf800000;
  vsCode.field_2._12_4_ = 0xbf800000;
  coords[0] = -1.0;
  coords[1] = 2.0;
  (**(code **)(lVar6 + 0x6c8))(1,&this->m_position_vbo_id);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"Error generating buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0xbd);
  (**(code **)(lVar6 + 0x40))(0x8892,this->m_position_vbo_id);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"Error binding buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0xc1);
  (**(code **)(lVar6 + 0x150))(0x8892,0x40,coords + 6);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"Error setting data for buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0xc5);
  (**(code **)(lVar6 + 0x6c8))(1,&this->m_text_coord_vbo_id);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"Error generating buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0xc9);
  (**(code **)(lVar6 + 0x40))(0x8892,this->m_text_coord_vbo_id);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"Error binding buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0xcd);
  (**(code **)(lVar6 + 0x150))(0x8892,0x20,(undefined1 *)((long)&vsCode.field_2 + 8),0x88e4);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"Error seting data for buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0xd1);
  GVar4 = (**(code **)(lVar6 + 0x3c8))();
  this->m_po_id = GVar4;
  GVar4 = (**(code **)(lVar6 + 0x3f0))(0x8b31);
  this->m_vs_id = GVar4;
  GVar4 = (**(code **)(lVar6 + 0x3f0))(0x8b30);
  this->m_fs_id = GVar4;
  TextureBorderClampSamplingTexture<unsigned_int,unsigned_int>::getVertexShaderCode_abi_cxx11_
            ((string *)&vsCodePtr,this);
  fshaderCode.field_2._8_8_ = std::__cxx11::string::c_str();
  TextureBorderClampSamplingTexture<unsigned_int,unsigned_int>::getFragmentShaderCode_abi_cxx11_
            ((string *)&fshaderCodePtr,this);
  local_d8 = (char *)std::__cxx11::string::c_str();
  bVar1 = TestCaseBase::buildProgram
                    (&this->super_TestCaseBase,this->m_po_id,this->m_fs_id,1,&local_d8,this->m_vs_id
                     ,1,(char **)((long)&fshaderCode.field_2 + 8),(bool *)0x0);
  if (!bVar1) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,
               "Program could not have been created sucessfully from a valid vertex/fragment shader!"
               ,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
               ,0xe5);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  createTextures(this);
  std::__cxx11::string::~string((string *)&fshaderCodePtr);
  std::__cxx11::string::~string((string *)&vsCodePtr);
  return;
}

Assistant:

void TextureBorderClampSamplingTexture<InputType, OutputType>::initTest(void)
{
	if (!m_is_texture_border_clamp_supported)
	{
		throw tcu::NotSupportedError(TEXTURE_BORDER_CLAMP_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Generate and bind VAO */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate vertex array object");
	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	/* Generate sampler object */
	gl.genSamplers(1, &m_sampler_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating sampler object!");

	/* Create framebuffer object */
	gl.genFramebuffers(1, &m_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating framebuffer object!");

	/* Set up clear color */
	gl.clearColor(0.5 /* red */, 0.5 /* green */, 0.5 /* blue */, 1 /* alpha */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting clear color value!");

	/* Input attributes for vertex shader */

	/* Full screen quad */
	glw::GLfloat vertices[] = { -1.0f, -1.0f, 0.0f, 1.0f, -1.0f, 1.0f, 0.0f, 1.0f,
								1.0f,  -1.0f, 0.0f, 1.0f, 1.0f,  1.0f, 0.0f, 1.0f };

	/* Texture coords */
	glw::GLfloat coords[] = {
		-1.0f, -1.0f, /* for bottom-left corner of the viewport */
		-1.0f, 2.0f,  /* for top-left corner of the viewport */
		2.0f,  -1.0f, /* for bottom-right corner of the viewport */
		2.0f,  2.0f   /* for top-right corner of the viewport */
	};

	/* Generate buffer object */
	gl.genBuffers(1, &m_position_vbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating buffer object!");

	/* Bind buffer object */
	gl.bindBuffer(GL_ARRAY_BUFFER, m_position_vbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding buffer object!");

	/* Set data for buffer object */
	gl.bufferData(GL_ARRAY_BUFFER, sizeof(vertices), vertices, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting data for buffer object!");

	/* Generate buffer object */
	gl.genBuffers(1, &m_text_coord_vbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating buffer object!");

	/* Bind buffer object */
	gl.bindBuffer(GL_ARRAY_BUFFER, m_text_coord_vbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding buffer object!");

	/* Set data for buffer object */
	gl.bufferData(GL_ARRAY_BUFFER, sizeof(coords), coords, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error seting data for buffer object!");

	/* Create program object */
	m_po_id = gl.createProgram();

	/* Create shader objects */
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);
	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);

	/* Get vertex shader code */
	std::string vsCode	= getVertexShaderCode();
	const char* vsCodePtr = (const char*)vsCode.c_str();

	/* Get fragment shader code */
	std::string fshaderCode	= getFragmentShaderCode();
	const char* fshaderCodePtr = (const char*)fshaderCode.c_str();

	/* Build program */
	if (!buildProgram(m_po_id, m_fs_id, 1, &fshaderCodePtr, m_vs_id, 1, &vsCodePtr))
	{
		TCU_FAIL("Program could not have been created sucessfully from a valid vertex/fragment shader!");
	}

	createTextures();
}